

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O3

void SCD_PCM_Reset(void *info)

{
  long lVar1;
  
  memset(*(void **)((long)info + 0xf8),0,(ulong)*(uint *)((long)info + 0xf4));
  *(undefined2 *)((long)info + 0xd) = 0;
  *(undefined2 *)((long)info + 0x10) = 0;
  lVar1 = 0;
  do {
    *(undefined2 *)((long)info + lVar1 + 0x14) = 0;
    *(undefined4 *)((long)info + lVar1 + 0x1a) = 0;
    *(undefined4 *)((long)info + lVar1 + 0x28) = 0;
    *(undefined8 *)((long)info + lVar1 + 0x20) = 0;
    lVar1 = lVar1 + 0x1c;
  } while (lVar1 != 0xe0);
  return;
}

Assistant:

static void SCD_PCM_Reset(void* info)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	int i;
	struct pcm_chan_* chan;
	
	// Clear the PCM memory.
	memset(chip->RAM, 0x00, chip->RAMSize);
	
	chip->Enable = 0;
	chip->Cur_Chan = 0;
	chip->Bank = 0;
	
	/* clear channel registers */
	for (i = 0; i < 8; i++)
	{
		chan = &chip->Channel[i];
		chan->Enable = 0;
		chan->ENV = 0;
		chan->PAN = 0;
		chan->St_Addr = 0;
		chan->Addr = 0;
		chan->Loop_Addr = 0;
		chan->Step = 0;
		chan->Step_B = 0;
		chan->Data = 0;
	}
}